

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getSlacks(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *p_vector)

{
  uint *puVar1;
  uint uVar2;
  fpclass_type fVar3;
  DataKey DVar4;
  undefined8 uVar5;
  int32_t iVar6;
  Status SVar7;
  int iVar8;
  SPxInternalCodeException *this_00;
  SPxStatusException *this_01;
  ulong uVar9;
  pointer pnVar10;
  long lVar11;
  DataKey local_a0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_90;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_88;
  DataKey local_80;
  string local_78;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  if (this->initialized == false) {
    this_01 = (SPxStatusException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_78,"XSOLVE11 No Problem loaded",(allocator *)&local_a0);
    SPxStatusException::SPxStatusException(this_01,&local_78);
    __cxa_throw(this_01,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == COLUMN) {
    uVar9 = (ulong)(uint)(this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    lVar11 = uVar9 * 0x50;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      switch((this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.rowstat.data[uVar9 - 1]) {
      case D_FREE:
      case D_ON_UPPER:
      case D_ON_LOWER:
      case D_ON_BOTH:
      case D_UNDEFINED:
        break;
      case P_FIXED:
      case P_ON_UPPER:
        pnVar10 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_002d9727;
      default:
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"XSOLVE12 This should never happen.",(allocator *)&local_a0);
        SPxInternalCodeException::SPxInternalCodeException(this_00,&local_78);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_ON_LOWER:
        pnVar10 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
LAB_002d9727:
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   ((long)&(p_vector->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11),
                   (cpp_dec_float<100U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar11));
        break;
      case P_FREE:
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   ((long)&(p_vector->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11),0)
        ;
      }
      lVar11 = lVar11 + -0x50;
    }
    uVar9 = (ulong)(uint)(this->thecovectors->set).thenum;
    local_90 = &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set;
    lVar11 = uVar9 * 10 + -1;
    local_98 = this;
    local_88 = p_vector;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      DVar4 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).theBaseId.data[uVar9 - 1].super_DataKey;
      if (DVar4.info < 0) {
        pnVar10 = (this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)((long)&pnVar10->m_backend + lVar11 * 8 + -0x48);
        puVar1 = (uint *)((long)&pnVar10->m_backend + lVar11 * 8 + -0x18);
        uStack_44 = *(undefined8 *)(puVar1 + 2);
        uStack_48 = (undefined4)((ulong)*(undefined8 *)puVar1 >> 0x20);
        puVar1 = (uint *)((long)&pnVar10->m_backend + lVar11 * 8 + -0x24);
        uStack_58 = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        uStack_50 = (undefined4)uVar5;
        local_4c = (undefined4)((ulong)uVar5 >> 0x20);
        puVar1 = (uint *)((long)&pnVar10->m_backend + lVar11 * 8 + -0x34);
        local_78.field_2._M_allocated_capacity = *(undefined8 *)puVar1;
        local_78.field_2._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar10->m_backend + lVar11 * 8 + -0x44);
        local_78._M_dataplus._M_p = *(pointer *)puVar1;
        local_78._M_string_length = *(size_type *)(puVar1 + 2);
        fVar3 = *(fpclass_type *)((long)&pnVar10->m_backend + lVar11 * 8 + -8);
        uVar5 = *(undefined8 *)((long)&pnVar10->m_backend + lVar11 * 8);
        iVar6 = *(int32_t *)((long)&pnVar10->m_backend + lVar11 * 8 + -4);
        local_80 = DVar4;
        SPxRowId::SPxRowId((SPxRowId *)&local_a0,(SPxId *)&local_80);
        iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number(local_90,&local_a0);
        pnVar10 = (local_88->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar10[iVar8].m_backend.data._M_elems[0] = uVar2;
        puVar1 = (uint *)((long)&pnVar10[iVar8].m_backend.data + 0x30);
        *(ulong *)puVar1 = CONCAT44(uStack_48,local_4c);
        *(undefined8 *)(puVar1 + 2) = uStack_44;
        puVar1 = (uint *)((long)&pnVar10[iVar8].m_backend.data + 0x24);
        *(undefined8 *)puVar1 = uStack_58;
        *(ulong *)(puVar1 + 2) = CONCAT44(local_4c,uStack_50);
        puVar1 = (uint *)((long)&pnVar10[iVar8].m_backend.data + 0x14);
        *(size_type *)puVar1 = local_78.field_2._M_allocated_capacity;
        *(undefined8 *)(puVar1 + 2) = local_78.field_2._8_8_;
        puVar1 = (uint *)((long)&pnVar10[iVar8].m_backend.data + 4);
        *(pointer *)puVar1 = local_78._M_dataplus._M_p;
        *(size_type *)(puVar1 + 2) = local_78._M_string_length;
        pnVar10[iVar8].m_backend.exp = fVar3;
        pnVar10[iVar8].m_backend.neg = (bool)((uVar2 != 0 || (int)uVar5 != 0) ^ (byte)iVar6);
        pnVar10[iVar8].m_backend.fpclass = (int)uVar5;
        pnVar10[iVar8].m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
        this = local_98;
      }
      lVar11 = lVar11 + -10;
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(p_vector,&this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
  }
  SVar7 = status(this);
  return SVar7;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getSlacks(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE11 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == COLUMN)
   {
      int i;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(i = this->nRows() - 1; i >= 0; --i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = this->lhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = this->rhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE12 This should never happen.");
         }
      }

      for(i = dim() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = -(*theFvec)[i];
      }
   }
   else
      p_vector = pVec();

   return status();
}